

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

bool __thiscall mkvmuxer::VideoTrack::SetProjection(VideoTrack *this,Projection *projection)

{
  Projection *this_00;
  bool bVar1;
  __uniq_ptr_data<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>,_true,_true>
  this_01;
  pointer __p;
  unique_ptr<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_> projection_ptr;
  
  this_01.super___uniq_ptr_impl<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_>.
  _M_t.super__Tuple_impl<0UL,_mkvmuxer::Projection_*,_std::default_delete<mkvmuxer::Projection>_>.
  super__Head_base<0UL,_mkvmuxer::Projection_*,_false>._M_head_impl =
       (__uniq_ptr_impl<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_>)
       operator_new(0x20);
  *(undefined8 *)
   this_01.super___uniq_ptr_impl<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_>.
   _M_t.super__Tuple_impl<0UL,_mkvmuxer::Projection_*,_std::default_delete<mkvmuxer::Projection>_>.
   super__Head_base<0UL,_mkvmuxer::Projection_*,_false>._M_head_impl = 0;
  *(undefined8 *)
   ((long)this_01.
          super___uniq_ptr_impl<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_>.
          _M_t.
          super__Tuple_impl<0UL,_mkvmuxer::Projection_*,_std::default_delete<mkvmuxer::Projection>_>
          .super__Head_base<0UL,_mkvmuxer::Projection_*,_false>._M_head_impl + 8) = 0;
  *(uint8_t **)
   ((long)this_01.
          super___uniq_ptr_impl<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_>.
          _M_t.
          super__Tuple_impl<0UL,_mkvmuxer::Projection_*,_std::default_delete<mkvmuxer::Projection>_>
          .super__Head_base<0UL,_mkvmuxer::Projection_*,_false>._M_head_impl + 0x10) =
       (uint8_t *)0x0;
  *(uint64_t *)
   ((long)this_01.
          super___uniq_ptr_impl<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_>.
          _M_t.
          super__Tuple_impl<0UL,_mkvmuxer::Projection_*,_std::default_delete<mkvmuxer::Projection>_>
          .super__Head_base<0UL,_mkvmuxer::Projection_*,_false>._M_head_impl + 0x18) = 0;
  projection_ptr._M_t.
  super___uniq_ptr_impl<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_>._M_t.
  super__Tuple_impl<0UL,_mkvmuxer::Projection_*,_std::default_delete<mkvmuxer::Projection>_>.
  super__Head_base<0UL,_mkvmuxer::Projection_*,_false>._M_head_impl =
       (__uniq_ptr_data<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>,_true,_true>
       )(__uniq_ptr_data<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>,_true,_true>
         )this_01.
          super___uniq_ptr_impl<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_>.
          _M_t.
          super__Tuple_impl<0UL,_mkvmuxer::Projection_*,_std::default_delete<mkvmuxer::Projection>_>
          .super__Head_base<0UL,_mkvmuxer::Projection_*,_false>._M_head_impl;
  if (projection->private_data_ != (uint8_t *)0x0) {
    bVar1 = Projection::SetProjectionPrivate
                      ((Projection *)
                       this_01.
                       super___uniq_ptr_impl<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_mkvmuxer::Projection_*,_std::default_delete<mkvmuxer::Projection>_>
                       .super__Head_base<0UL,_mkvmuxer::Projection_*,_false>._M_head_impl,
                       projection->private_data_,projection->private_data_length_);
    if (!bVar1) {
      bVar1 = false;
      goto LAB_0014ee1b;
    }
  }
  *(ProjectionType *)
   this_01.super___uniq_ptr_impl<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_>.
   _M_t.super__Tuple_impl<0UL,_mkvmuxer::Projection_*,_std::default_delete<mkvmuxer::Projection>_>.
   super__Head_base<0UL,_mkvmuxer::Projection_*,_false>._M_head_impl = projection->type_;
  *(undefined8 *)
   ((long)this_01.
          super___uniq_ptr_impl<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_>.
          _M_t.
          super__Tuple_impl<0UL,_mkvmuxer::Projection_*,_std::default_delete<mkvmuxer::Projection>_>
          .super__Head_base<0UL,_mkvmuxer::Projection_*,_false>._M_head_impl + 4) =
       *(undefined8 *)&projection->pose_yaw_;
  *(float *)((long)this_01.
                   super___uniq_ptr_impl<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_mkvmuxer::Projection_*,_std::default_delete<mkvmuxer::Projection>_>
                   .super__Head_base<0UL,_mkvmuxer::Projection_*,_false>._M_head_impl + 0xc) =
       projection->pose_roll_;
  this_00 = this->projection_;
  if (this_00 != (Projection *)0x0) {
    Projection::~Projection(this_00);
  }
  operator_delete(this_00);
  projection_ptr._M_t.
  super___uniq_ptr_impl<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_>._M_t.
  super__Tuple_impl<0UL,_mkvmuxer::Projection_*,_std::default_delete<mkvmuxer::Projection>_>.
  super__Head_base<0UL,_mkvmuxer::Projection_*,_false>._M_head_impl =
       (__uniq_ptr_data<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>,_true,_true>
       )(__uniq_ptr_impl<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_>)0x0;
  this->projection_ =
       (Projection *)
       this_01.
       super___uniq_ptr_impl<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_>._M_t.
       super__Tuple_impl<0UL,_mkvmuxer::Projection_*,_std::default_delete<mkvmuxer::Projection>_>.
       super__Head_base<0UL,_mkvmuxer::Projection_*,_false>._M_head_impl;
  bVar1 = true;
LAB_0014ee1b:
  std::unique_ptr<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_>::~unique_ptr
            (&projection_ptr);
  return bVar1;
}

Assistant:

bool VideoTrack::SetProjection(const Projection& projection) {
  std::unique_ptr<Projection> projection_ptr(new Projection());
  if (!projection_ptr.get())
    return false;

  if (projection.private_data()) {
    if (!projection_ptr->SetProjectionPrivate(
            projection.private_data(), projection.private_data_length())) {
      return false;
    }
  }

  projection_ptr->set_type(projection.type());
  projection_ptr->set_pose_yaw(projection.pose_yaw());
  projection_ptr->set_pose_pitch(projection.pose_pitch());
  projection_ptr->set_pose_roll(projection.pose_roll());
  delete projection_;
  projection_ = projection_ptr.release();
  return true;
}